

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_join_leave.cxx
# Opt level: O2

ptr<resp_msg> __thiscall
nuraft::raft_server::handle_leave_cluster_req(raft_server *this,req_msg *req)

{
  pointer psVar1;
  _func_int **pp_Var2;
  int iVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  shared_ptr<nuraft::resp_msg> sVar5;
  undefined1 auVar6 [16];
  ptr<resp_msg> pVar7;
  int local_3c;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)req[9].super_msg_base._vptr_msg_base[1];
  local_3c = 0xf;
  sVar5 = std::make_shared<nuraft::resp_msg,unsigned_long,nuraft::msg_type,int&,int>
                    ((unsigned_long *)this,(msg_type *)&local_38,&local_3c,(int *)&req->log_entries_
                    );
  _Var4 = sVar5.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (*(char *)((long)&req[2].log_entries_.
                       super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) == '\0') {
    psVar1 = req[9].log_entries_.
             super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (psVar1 != (pointer)0x0) {
      iVar3 = (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr[1].buff_.
                        super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)();
      if (4 < iVar3) {
        psVar1 = req[9].log_entries_.
                 super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
        msg_if_given_abi_cxx11_(&local_38,"leave cluster, set steps to down to 2");
        (*(code *)(psVar1->super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                  [1].buff_.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)
                  (psVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_join_leave.cxx"
                   ,"handle_leave_cluster_req",0x1c5,&local_38);
        std::__cxx11::string::~string((string *)&local_38);
      }
    }
    *(undefined4 *)((long)&req[4].super_msg_base.term_ + 4) = 2;
    pp_Var2 = this->_vptr_raft_server;
    auVar6 = (**(code **)(**(long **)&req[9].super_msg_base.type_ + 0x10))();
    _Var4._M_pi = auVar6._8_8_;
    pp_Var2[4] = auVar6._0_8_;
    *(undefined1 *)(pp_Var2 + 6) = 1;
  }
  pVar7.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  pVar7.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar7.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_leave_cluster_req(req_msg& req) {
    ptr<resp_msg> resp
        ( cs_new<resp_msg>( state_->get_term(),
                            msg_type::leave_cluster_response,
                            id_,
                            req.get_src() ) );
    if (!config_changing_) {
        p_db("leave cluster, set steps to down to 2");
        // NOTE: We don't call `RemovedFromCluster` callback here,
        //       as cluster config still contains this server.
        //       The callback will be called by either `reconfigure()` (normal path)
        //       or `handle_prevote_resp()` (otherwise).
        //
        //       If this leave cluster message cannot reach quorum,
        //       the new leader's config log (containing this server) will clear
        //       `steps_to_down_` to 0.
        steps_to_down_ = 2;
        resp->accept(log_store_->next_slot());
    }

    return resp;
}